

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

FSE_repeat
ZSTD_dictNCountRepeat(short *normalizedCounter,uint dictMaxSymbolValue,uint maxSymbolValue)

{
  uint local_24;
  U32 s;
  uint maxSymbolValue_local;
  uint dictMaxSymbolValue_local;
  short *normalizedCounter_local;
  
  if (dictMaxSymbolValue < maxSymbolValue) {
    normalizedCounter_local._4_4_ = FSE_repeat_check;
  }
  else {
    for (local_24 = 0; local_24 <= maxSymbolValue; local_24 = local_24 + 1) {
      if (normalizedCounter[local_24] == 0) {
        return FSE_repeat_check;
      }
    }
    normalizedCounter_local._4_4_ = FSE_repeat_valid;
  }
  return normalizedCounter_local._4_4_;
}

Assistant:

static FSE_repeat ZSTD_dictNCountRepeat(short* normalizedCounter, unsigned dictMaxSymbolValue, unsigned maxSymbolValue)
{
    U32 s;
    if (dictMaxSymbolValue < maxSymbolValue) {
        return FSE_repeat_check;
    }
    for (s = 0; s <= maxSymbolValue; ++s) {
        if (normalizedCounter[s] == 0) {
            return FSE_repeat_check;
        }
    }
    return FSE_repeat_valid;
}